

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

int __thiscall DmgFactors::Apply(DmgFactors *this,FName *type,int damage)

{
  double *pdVar1;
  FName local_20;
  FName local_1c;
  
  local_1c = (FName)type->Index;
  pdVar1 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                     (&this->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                      &local_1c);
  if (pdVar1 == (double *)0x0) {
    if (type->Index == 0) {
      return damage;
    }
    local_20.Index = 0;
    pdVar1 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                       (&this->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                        &local_20);
    if (pdVar1 == (double *)0x0) {
      return damage;
    }
  }
  return (int)((double)damage * *pdVar1);
}

Assistant:

int DmgFactors::Apply(FName type, int damage)
{
	auto pdf = CheckKey(type);
	if (pdf == NULL && type != NAME_None)
	{
		pdf = CheckKey(NAME_None);
	}
	if (!pdf) return damage;
	return int(damage * *pdf);
}